

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O0

void __thiscall
DifferentialEquation::setParameter(DifferentialEquation *this,string *name,string *value)

{
  bool bVar1;
  double local_1c0;
  double d;
  stringstream local_1a8 [8];
  stringstream setting;
  ostream local_198;
  string *local_20;
  string *value_local;
  string *name_local;
  DifferentialEquation *this_local;
  
  local_20 = value;
  value_local = name;
  name_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = std::operator==(value_local,"starting-value");
  if (bVar1) {
    std::operator<<(&local_198,(string *)local_20);
    std::istream::operator>>((istream *)local_1a8,&local_1c0);
    (*(this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric
      [0xf])(local_1c0);
  }
  else {
    bVar1 = std::operator==(value_local,"mode");
    if (bVar1) {
      bVar1 = std::operator==(local_20,"ito");
      if (bVar1) {
        setIto(this);
      }
      bVar1 = std::operator==(local_20,"stratonovitch");
      if (bVar1) {
        setStratonovich(this);
      }
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void DifferentialEquation::setParameter( const string& name, const string& value )
{
	stringstream setting;
	
	// first value
	if (name=="starting-value") {
		double d;
		setting << value;
		setting >> d;
		init(d);
	}
	
	// mode
	else if (name=="mode") {
		if (value=="ito")
			setIto();
		if (value=="stratonovitch")
			setStratonovich();
	}
}